

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool __thiscall
despot::option::PrintUsageImplementation::LinePartIterator::nextTable(LinePartIterator *this)

{
  Descriptor *pDVar1;
  Descriptor *pDVar2;
  Descriptor *pDVar3;
  char *pcVar4;
  
  if (this->rowdesc != (Descriptor *)0x0) {
    pcVar4 = this->tablestart->help;
    pDVar3 = this->tablestart;
    while ((pcVar4 != (char *)0x0 && (pDVar3->shortopt != (char *)0x0))) {
      this->tablestart = pDVar3 + 1;
      pcVar4 = pDVar3[1].help;
      pDVar3 = pDVar3 + 1;
    }
  }
  pDVar3 = this->tablestart;
  pcVar4 = pDVar3->help;
  if ((pcVar4 == (char *)0x0) && (pDVar1 = pDVar3, pDVar3->shortopt != (char *)0x0)) {
    do {
      pDVar3 = pDVar1 + 1;
      pcVar4 = pDVar1[1].help;
      if (pcVar4 != (char *)0x0) break;
      pDVar2 = pDVar1 + 1;
      pDVar1 = pDVar3;
    } while (pDVar2->shortopt != (char *)0x0);
    this->tablestart = pDVar3;
  }
  this->rowdesc = pDVar3;
  this->rowstart = pcVar4;
  this->ptr = (char *)0x0;
  return pcVar4 != (char *)0x0;
}

Assistant:

bool nextTable() {
			// If this is NOT the first time nextTable() is called after the constructor,
			// then skip to the next table break (i.e. a Descriptor with help == 0)
			if (rowdesc != 0) {
				while (tablestart->help != 0 && tablestart->shortopt != 0)
					++tablestart;
			}

			// Find the next table after the break (if any)
			while (tablestart->help == 0 && tablestart->shortopt != 0)
				++tablestart;

			restartTable();
			return rowstart != 0;
		}